

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choices.hpp
# Opt level: O1

int Random::WeightedChoiceIndex<std::shared_ptr<Polymer>>
              (vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>
               *population,vector<double,_std::allocator<double>_> *weights)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  pointer pdVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  vector<double,_std::allocator<double>_> cum_weights;
  allocator_type local_31;
  double local_30;
  vector<double,_std::allocator<double>_> local_28;
  
  random();
  local_30 = extraout_XMM0_Qa;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_28,
             (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_31);
  pdVar1 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    dVar7 = *pdVar1;
    *local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = dVar7;
    pdVar5 = local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    while (pdVar1 = pdVar1 + 1, pdVar1 != pdVar2) {
      pdVar5 = pdVar5 + 1;
      dVar7 = dVar7 + *pdVar1;
      *pdVar5 = dVar7;
    }
  }
  uVar3 = (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  pdVar6 = local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (long)uVar3) {
    do {
      uVar4 = uVar3 >> 1;
      if (pdVar6[uVar4] <=
          local_30 *
          local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish[-1]) {
        pdVar6 = pdVar6 + uVar4 + 1;
        uVar4 = ~uVar4 + uVar3;
      }
      uVar3 = uVar4;
    } while (0 < (long)uVar4);
  }
  if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (int)((ulong)((long)pdVar6 -
                      (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int WeightedChoiceIndex(const std::vector<T> &population,
                        const std::vector<double> &weights) {
  double random_num = random();
  // Calculate cumulative sums for weights
  std::vector<double> cum_weights(weights.size());
  std::partial_sum(weights.begin(), weights.end(), cum_weights.begin());
  // Bisect cumulative weights vector
  std::vector<double>::iterator upper;
  upper = std::upper_bound(cum_weights.begin(), cum_weights.end(),
                           random_num * cum_weights.back());
  // Calculate index and return list item at index
  int index = (upper - cum_weights.begin());
  return index;
}